

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O0

void __thiscall
flatbuffers::go::GoGenerator::GetStructFieldOfTable
          (GoGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  string local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string local_140;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string *local_30;
  string *code;
  string *code_ptr_local;
  FieldDef *field_local;
  StructDef *struct_def_local;
  GoGenerator *this_local;
  
  local_30 = code_ptr;
  code = code_ptr;
  code_ptr_local = (string *)field;
  field_local = (FieldDef *)struct_def;
  struct_def_local = (StructDef *)this;
  GenReceiver(this,struct_def,code_ptr);
  IdlNamer::Function_abi_cxx11_(&local_70,&this->namer_,(Definition *)code_ptr_local);
  std::operator+(&local_50," ",&local_70);
  std::__cxx11::string::operator+=((string *)local_30,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::operator+=((string *)local_30,"(obj *");
  TypeName_abi_cxx11_(&local_a0,this,(FieldDef *)code_ptr_local);
  std::__cxx11::string::operator+=((string *)local_30,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  TypeName_abi_cxx11_(&local_120,this,(FieldDef *)code_ptr_local);
  std::operator+(&local_100,") *",&local_120);
  std::operator+(&local_e0,&local_100," ");
  OffsetPrefix_abi_cxx11_(&local_140,this,(FieldDef *)code_ptr_local);
  std::operator+(&local_c0,&local_e0,&local_140);
  std::__cxx11::string::operator+=((string *)local_30,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  if ((*(byte *)(code_ptr_local[6].field_2._M_allocated_capacity + 0x110) & 1) == 0) {
    std::__cxx11::string::operator+=
              ((string *)local_30,"\t\tx := rcv._tab.Indirect(o + rcv._tab.Pos)\n");
  }
  else {
    std::__cxx11::string::operator+=((string *)local_30,"\t\tx := o + rcv._tab.Pos\n");
  }
  std::__cxx11::string::operator+=((string *)local_30,"\t\tif obj == nil {\n");
  TypeName_abi_cxx11_(&local_1a0,this,(FieldDef *)code_ptr_local);
  std::operator+(&local_180,"\t\t\tobj = new(",&local_1a0);
  std::operator+(&local_160,&local_180,")\n");
  std::__cxx11::string::operator+=((string *)local_30,(string *)&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::operator+=((string *)local_30,"\t\t}\n");
  std::__cxx11::string::operator+=((string *)local_30,"\t\tobj.Init(rcv._tab.Bytes, x)\n");
  std::__cxx11::string::operator+=((string *)local_30,"\t\treturn obj\n\t}\n\treturn nil\n");
  std::__cxx11::string::operator+=((string *)local_30,"}\n\n");
  return;
}

Assistant:

void GetStructFieldOfTable(const StructDef &struct_def, const FieldDef &field,
                             std::string *code_ptr) {
    std::string &code = *code_ptr;
    GenReceiver(struct_def, code_ptr);
    code += " " + namer_.Function(field);
    code += "(obj *";
    code += TypeName(field);
    code += ") *" + TypeName(field) + " " + OffsetPrefix(field);
    if (field.value.type.struct_def->fixed) {
      code += "\t\tx := o + rcv._tab.Pos\n";
    } else {
      code += "\t\tx := rcv._tab.Indirect(o + rcv._tab.Pos)\n";
    }
    code += "\t\tif obj == nil {\n";
    code += "\t\t\tobj = new(" + TypeName(field) + ")\n";
    code += "\t\t}\n";
    code += "\t\tobj.Init(rcv._tab.Bytes, x)\n";
    code += "\t\treturn obj\n\t}\n\treturn nil\n";
    code += "}\n\n";
  }